

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string&,std::__cxx11::string&,cmValue&>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   cmValue *args)

{
  string *psVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_110;
  string_view local_f8;
  string *local_e8;
  string_view local_e0;
  string *local_d0;
  cmAlphaNum local_c8;
  cmAlphaNum local_90;
  cmAlphaNum local_58;
  
  local_58.RValueString_ = (string *)0x0;
  local_58.View_._M_str = (a->_M_dataplus)._M_p;
  local_58.View_._M_len = a->_M_string_length;
  local_110.first = cmAlphaNum::View(&local_58);
  local_110.second = local_58.RValueString_;
  local_90.RValueString_ = (string *)0x0;
  local_90.View_._M_str = (b->_M_dataplus)._M_p;
  local_90.View_._M_len = b->_M_string_length;
  local_f8 = cmAlphaNum::View(&local_90);
  local_e8 = local_90.RValueString_;
  psVar1 = args->Value;
  local_c8.RValueString_ = (string *)0x0;
  if (psVar1 == (string *)0x0) {
    psVar1 = &cmValue::Empty_abi_cxx11_;
  }
  local_c8.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_c8.View_._M_len = psVar1->_M_string_length;
  local_e0 = cmAlphaNum::View(&local_c8);
  local_d0 = local_c8.RValueString_;
  views._M_len = 3;
  views._M_array = &local_110;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}